

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_concurrent.hpp
# Opt level: O2

void boost::unordered::detail::foa::
     concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
     ::set_group_access(allocator_type *param_1,long param_2)

{
  size_t i;
  pointer pgVar1;
  ulong uVar2;
  
  pgVar1 = std::allocator_traits<std::allocator<boost::unordered::detail::foa::group_access>_>::
           allocate(param_1,*(long *)(param_2 + 8) + 1);
  *(pointer *)(param_2 + 0x20) = pgVar1;
  for (uVar2 = 0; uVar2 < *(long *)(param_2 + 8) + 1U; uVar2 = uVar2 + 1) {
    *(undefined8 *)(*(long *)(param_2 + 0x20) + uVar2 * 8) = 0;
  }
  return;
}

Assistant:

static void set_group_access(group_access_allocator_type al, concurrent_table_arrays& arrays,
                                 std::false_type /* fancy pointers */) {
        arrays.group_accesses_ = std::allocator_traits<std::remove_cvref_t<decltype(al)>>::allocate(
            al, arrays.groups_size_mask + 1);

        for (std::size_t i = 0; i < arrays.groups_size_mask + 1; ++i) {
            ::new (arrays.group_accesses() + i) group_access();
        }
    }